

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

bool __thiscall QAccessibleTable::selectColumn(QAccessibleTable *this,int column)

{
  char cVar1;
  SelectionBehavior SVar2;
  SelectionMode SVar3;
  int iVar4;
  QAbstractItemView *this_00;
  QAbstractItemModel *pQVar5;
  QItemSelectionModel *pQVar6;
  QAbstractItemView *this_01;
  bool bVar7;
  long in_FS_OFFSET;
  int local_78;
  int iStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 *local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractItemView *)view(this);
  pQVar5 = QAbstractItemView::model(this_00);
  pQVar6 = QAbstractItemView::selectionModel(this_00);
  if (pQVar6 == (QItemSelectionModel *)0x0 || pQVar5 == (QAbstractItemModel *)0x0)
  goto LAB_004da23c;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::rootIndex((QModelIndex *)&local_58,this_00);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = -0x55555556;
  iStack_74 = -0x55555556;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  (**(code **)(*(long *)pQVar5 + 0x60))(&local_78,pQVar5,0,column,(QModelIndex *)&local_58);
  bVar7 = false;
  if (((local_78 < 0) || (bVar7 = false, iStack_74 < 0)) || (local_68 == (undefined1 *)0x0))
  goto LAB_004da23e;
  this_01 = (QAbstractItemView *)view(this);
  SVar2 = QAbstractItemView::selectionBehavior(this_01);
  if (SVar2 != SelectRows) {
    SVar3 = QAbstractItemView::selectionMode(this_00);
    if (SVar3 != NoSelection) {
      if (SVar3 == ContiguousSelection) {
LAB_004da299:
        if (column != 0) {
          cVar1 = QItemSelectionModel::isColumnSelected
                            ((int)pQVar6,(QModelIndex *)(ulong)(column - 1));
          if (cVar1 != '\0') goto LAB_004da2d2;
        }
        cVar1 = QItemSelectionModel::isColumnSelected
                          ((int)pQVar6,(QModelIndex *)(ulong)(column + 1));
        if (cVar1 == '\0') {
          QAbstractItemView::clearSelection(this_00);
        }
      }
      else if (SVar3 == SingleSelection) {
        SVar2 = QAbstractItemView::selectionBehavior(this_00);
        if (SVar2 != SelectColumns) {
          iVar4 = (**(code **)(*(long *)this + 0x60))(this);
          if (1 < iVar4) goto LAB_004da23c;
        }
        goto LAB_004da299;
      }
LAB_004da2d2:
      (**(code **)(*(long *)pQVar6 + 0x68))(pQVar6,&local_78,0x42);
      bVar7 = true;
      goto LAB_004da23e;
    }
  }
LAB_004da23c:
  bVar7 = false;
LAB_004da23e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QAccessibleTable::selectColumn(int column)
{
    QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    auto *selectionModel = theView->selectionModel();
    if (!theModel || !selectionModel)
        return false;

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = theModel->index(0, column, rootIndex);

    if (!index.isValid() || view()->selectionBehavior() == QAbstractItemView::SelectRows)
        return false;

    switch (theView->selectionMode()) {
    case QAbstractItemView::NoSelection:
        return false;
    case QAbstractItemView::SingleSelection:
        if (theView->selectionBehavior() != QAbstractItemView::SelectColumns && rowCount() > 1)
            return false;
        Q_FALLTHROUGH();
    case QAbstractItemView::ContiguousSelection:
        if ((!column || !selectionModel->isColumnSelected(column - 1, rootIndex))
            && !selectionModel->isColumnSelected(column + 1, rootIndex)) {
            theView->clearSelection();
        }
        break;
    default:
        break;
    }

    selectionModel->select(index, QItemSelectionModel::Select | QItemSelectionModel::Columns);
    return true;
}